

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# runtime_interface.cpp
# Opt level: O0

void __thiscall RuntimeInterface::~RuntimeInterface(RuntimeInterface *this)

{
  lock_guard<std::mutex> local_80;
  lock_guard<std::mutex> mlock;
  allocator local_59;
  string local_58;
  allocator local_31;
  undefined1 local_30 [8];
  string info_message;
  RuntimeInterface *this_local;
  
  this->_vptr_RuntimeInterface = (_func_int **)&PTR__RuntimeInterface_001b1a98;
  info_message.field_2._8_8_ = this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)local_30,"RuntimeInterface being destroyed.",&local_31);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_58,"",&local_59);
  mlock._M_device = (mutex_type *)0x0;
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&mlock);
  LoaderLogger::LogInfoMessage
            (&local_58,(string *)local_30,
             (vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&mlock);
  std::vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_>::~vector
            ((vector<XrSdkLogObjectInfo,_std::allocator<XrSdkLogObjectInfo>_> *)&mlock);
  std::__cxx11::string::~string((string *)&local_58);
  std::allocator<char>::~allocator((allocator<char> *)&local_59);
  std::lock_guard<std::mutex>::lock_guard(&local_80,&this->_dispatch_table_mutex);
  std::
  unordered_map<XrInstance_T_*,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>_>
  ::clear(&this->_dispatch_table_map);
  std::lock_guard<std::mutex>::~lock_guard(&local_80);
  LoaderPlatformLibraryClose(this->_runtime_library);
  std::__cxx11::string::~string((string *)local_30);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&this->_supported_extensions);
  std::
  unordered_map<XrDebugUtilsMessengerEXT_T_*,_XrInstance_T_*,_std::hash<XrDebugUtilsMessengerEXT_T_*>,_std::equal_to<XrDebugUtilsMessengerEXT_T_*>,_std::allocator<std::pair<XrDebugUtilsMessengerEXT_T_*const,_XrInstance_T_*>_>_>
  ::~unordered_map(&this->_messenger_to_instance_map);
  std::
  unordered_map<XrInstance_T_*,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>,_std::hash<XrInstance_T_*>,_std::equal_to<XrInstance_T_*>,_std::allocator<std::pair<XrInstance_T_*const,_std::unique_ptr<XrGeneratedDispatchTableCore,_std::default_delete<XrGeneratedDispatchTableCore>_>_>_>_>
  ::~unordered_map(&this->_dispatch_table_map);
  return;
}

Assistant:

RuntimeInterface::~RuntimeInterface() {
    std::string info_message = "RuntimeInterface being destroyed.";
    LoaderLogger::LogInfoMessage("", info_message);
    {
        std::lock_guard<std::mutex> mlock(_dispatch_table_mutex);
        _dispatch_table_map.clear();
    }
    LoaderPlatformLibraryClose(_runtime_library);
}